

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O3

int dumb_it_trim_silent_patterns(DUH *duh)

{
  bool bVar1;
  int iVar2;
  DUMB_IT_SIGDATA *pDVar3;
  uint uVar4;
  IT_PATTERN *pIVar5;
  ulong uVar6;
  long lVar7;
  
  if ((((duh != (DUH *)0x0) && (pDVar3 = duh_get_it_sigdata(duh), pDVar3 != (DUMB_IT_SIGDATA *)0x0))
      && (pDVar3->order != (uchar *)0x0)) && (pDVar3->pattern != (IT_PATTERN *)0x0)) {
    uVar4 = pDVar3->n_orders;
    lVar7 = 0;
    if (0 < (int)uVar4) {
      do {
        if ((int)(uint)pDVar3->order[lVar7] < pDVar3->n_patterns) {
          pIVar5 = pDVar3->pattern + pDVar3->order[lVar7];
          iVar2 = is_pattern_silent(pIVar5,(int)lVar7);
          if (iVar2 < 2) break;
          pIVar5->n_rows = 1;
          pIVar5->n_entries = 0;
          if (pIVar5->entry != (IT_ENTRY *)0x0) {
            free(pIVar5->entry);
            pIVar5->entry = (IT_ENTRY *)0x0;
            uVar4 = pDVar3->n_orders;
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (int)uVar4);
    }
    if (0 < (int)uVar4 && (uint)lVar7 != uVar4) {
      uVar6 = (ulong)uVar4;
      do {
        if ((int)(uint)pDVar3->order[uVar6 - 1] < pDVar3->n_patterns) {
          pIVar5 = pDVar3->pattern + pDVar3->order[uVar6 - 1];
          iVar2 = is_pattern_silent(pIVar5,(int)uVar6 + -1);
          if (iVar2 < 2) {
            return -(uint)((long)uVar6 < 1);
          }
          pIVar5->n_rows = 1;
          pIVar5->n_entries = 0;
          if (pIVar5->entry != (IT_ENTRY *)0x0) {
            free(pIVar5->entry);
            pIVar5->entry = (IT_ENTRY *)0x0;
          }
        }
        bVar1 = 1 < uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar1);
    }
  }
  return -1;
}

Assistant:

int DUMBEXPORT dumb_it_trim_silent_patterns(DUH * duh) {
	int n;
	DUMB_IT_SIGDATA *sigdata;

	if (!duh) return -1;

	sigdata = duh_get_it_sigdata(duh);

	if (!sigdata || !sigdata->order || !sigdata->pattern) return -1;

	for (n = 0; n < sigdata->n_orders; n++) {
		int p = sigdata->order[n];
		if (p < sigdata->n_patterns) {
			IT_PATTERN * pattern = &sigdata->pattern[p];
			if (is_pattern_silent(pattern, n) > 1) {
				pattern->n_rows = 1;
				pattern->n_entries = 0;
				if (pattern->entry)
				{
					free(pattern->entry);
					pattern->entry = NULL;
				}
			} else
				break;
		}
	}

	if (n == sigdata->n_orders) return -1;

	for (n = sigdata->n_orders - 1; n >= 0; n--) {
		int p = sigdata->order[n];
		if (p < sigdata->n_patterns) {
			IT_PATTERN * pattern = &sigdata->pattern[p];
			if (is_pattern_silent(pattern, n) > 1) {
				pattern->n_rows = 1;
				pattern->n_entries = 0;
				if (pattern->entry)
				{
					free(pattern->entry);
					pattern->entry = NULL;
				}
			} else
				break;
		}
	}

	if (n < 0) return -1;

	/*duh->length = dumb_it_build_checkpoints(sigdata, 0);*/

	return 0;
}